

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

void __thiscall L11_2::Vector::reset(Vector *this,double arg1,double arg2,MODE mode)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  if (mode == RECT) {
    this->_x = arg1;
    this->_y = arg2;
    dVar3 = arg1 * arg1 + arg2 * arg2;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    this->_radius = dVar3;
    dVar3 = atan2(this->_y,this->_x);
    lVar2 = 0x10;
  }
  else {
    this->_radius = arg1;
    this->_radian = arg2;
    dVar3 = cos(arg2);
    this->_x = dVar3 * arg1;
    dVar1 = this->_radius;
    dVar3 = sin(this->_radian);
    dVar3 = dVar3 * dVar1;
    lVar2 = 8;
  }
  *(double *)((long)&this->_x + lVar2) = dVar3;
  return;
}

Assistant:

void Vector::reset(double arg1, double arg2, MODE mode) {
        if (mode == MODE::RECT) {
            _x = arg1;
            _y = arg2;
            _radius = std::sqrt(_x * _x + _y * _y);
            _radian = std::atan2(_y, _x);
        } else {
            _radius = arg1;
            _radian = arg2;
            _x = _radius * std::cos(_radian);
            _y = _radius * std::sin(_radian);
        }
    }